

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

Symbol * __thiscall
ByteCodeGenerator::FindSymbol
          (ByteCodeGenerator *this,Symbol **symRef,IdentPtr pid,bool forReference)

{
  undefined1 *puVar1;
  IdentPtr pIVar2;
  Scope *symScope;
  FuncInfo *funcInfo;
  FuncInfo *pFVar3;
  code *pcVar4;
  bool bVar5;
  PropertyId PVar6;
  undefined8 in_RAX;
  undefined4 *puVar7;
  char16 *pcVar8;
  Type *ppFVar9;
  Scope *pSVar10;
  undefined7 in_register_00000009;
  Symbol *this_00;
  ByteCodeGenerator *this_01;
  undefined8 local_38;
  PropertyId i;
  
  local_38 = in_RAX;
  if (symRef == (Symbol **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x6a0,"(symRef)","symRef");
    if (!bVar5) goto LAB_0083160e;
    *puVar7 = 0;
  }
  this_00 = *symRef;
  if (this_00 == (Symbol *)0x0) {
    AssignPropertyId(this,pid);
    this_00 = (Symbol *)0x0;
  }
  else {
    pIVar2 = this_00->pid;
    symScope = this_00->scope;
    if (symScope == (Scope *)0x0) {
      local_38 = CONCAT44((int)CONCAT71(in_register_00000009,forReference),(PropertyId)local_38);
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                         ,0x6ad,"(symScope)","symScope");
      if (!bVar5) {
LAB_0083160e:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
      forReference = SUB81((ulong)local_38 >> 0x20,0);
    }
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,ByteCodePhase);
    if (bVar5) {
      pcVar8 = Symbol::GetSymbolTypeName(this_00);
      Output::Print(L"resolved %s to symbol of type %s: \n",&pIVar2->field_0x22,pcVar8);
    }
    if ((*(ushort *)&this_00->field_0x42 & 0x4008) == 0) {
      ppFVar9 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this->funcInfoStack->
                            super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      funcInfo = *ppFVar9;
      bVar5 = symScope->func != funcInfo;
      if (forReference != false) {
        pSVar10 = FindScopeForSym(this,symScope,(Scope *)0x0,(PropertyId *)&local_38,funcInfo);
        if ((pSVar10 != symScope) && ((pSVar10->field_0x44 & 1) != 0)) {
          Symbol::SetHasNonLocalReference(this_00);
          Scope::SetIsObject(symScope);
          bVar5 = true;
        }
      }
      if ((bVar5) || ((this_00->field_0x42 & 0x10) != 0)) {
        ProcessCapturedSym(this,this_00);
        this_01 = (ByteCodeGenerator *)funcInfo->byteCodeFunction;
        PVar6 = Js::ParseableFunctionInfo::GetOrAddPropertyIdTracked
                          ((ParseableFunctionInfo *)this_01,&this_00->name);
        this_00->position = PVar6;
        ProcessScopeWithCapturedSym(this_01,symScope);
        pFVar3 = symScope->func;
        if (((*(uint *)&pFVar3->field_0xb4 & 8) != 0) && (this_00->symbolType == STFormal)) {
          *(uint *)&pFVar3->field_0xb4 = *(uint *)&pFVar3->field_0xb4 | 0x10;
          puVar1 = &(pFVar3->byteCodeFunction->super_FunctionProxy).field_0x45;
          *(ushort *)puVar1 = *(ushort *)puVar1 & 0xdfff;
        }
        if (symScope->func != funcInfo) {
          funcInfo->field_0xb4 = funcInfo->field_0xb4 | 0x80;
        }
      }
      if ((this_00->field_0x42 & 0x20) != 0) {
        puVar1 = &symScope->func->field_0xb4;
        *(uint *)puVar1 = *(uint *)puVar1 | 0x200;
      }
    }
  }
  return this_00;
}

Assistant:

Symbol * ByteCodeGenerator::FindSymbol(Symbol **symRef, IdentPtr pid, bool forReference)
{
    const char16 *key = nullptr;

    Symbol *sym = nullptr;
    Assert(symRef);
    if (*symRef)
    {
        sym = *symRef;
    }
    else
    {
        this->AssignPropertyId(pid);
        return nullptr;
    }
    key = reinterpret_cast<const char16*>(sym->GetPid()->Psz());

    Scope *symScope = sym->GetScope();
    Assert(symScope);

#if DBG_DUMP
    if (this->Trace())
    {
        if (sym != nullptr)
        {
            Output::Print(_u("resolved %s to symbol of type %s: \n"), key, sym->GetSymbolTypeName());
        }
        else
        {
            Output::Print(_u("did not resolve %s\n"), key);
        }
    }
#endif

    if (!sym->GetIsGlobal() && !sym->GetIsModuleExportStorage())
    {
        FuncInfo *top = funcInfoStack->Top();

        bool nonLocalRef = symScope->GetFunc() != top;
        Scope *scope = nullptr;
        if (forReference)
        {
            Js::PropertyId i;
            scope = FindScopeForSym(symScope, nullptr, &i, top);
            // If we have a reference to a local within a with, we want to generate a closure represented by an object.
            if (scope != symScope && scope->GetIsDynamic())
            {
                nonLocalRef = true;
                sym->SetHasNonLocalReference();
                symScope->SetIsObject();
            }
        }

        // This may not be a non-local reference, but the symbol may still be accessed non-locally. ('with', e.g.)
        // In that case, make sure we still process the symbol and its scope for closure capture.
        if (nonLocalRef || sym->GetHasNonLocalReference())
        {
            // Symbol referenced through a closure. Mark it as such and give it a property ID.
            this->ProcessCapturedSym(sym);
            sym->SetPosition(top->byteCodeFunction->GetOrAddPropertyIdTracked(sym->GetName()));
            // If this is var is local to a function (meaning that it belongs to the function's scope
            // *or* to scope that need not be instantiated, like a function expression scope, which we'll
            // merge with the function scope, then indicate that fact.
            this->ProcessScopeWithCapturedSym(symScope);
            if (symScope->GetFunc()->GetHasArguments() && sym->GetIsFormal())
            {
                // A formal is referenced non-locally. We need to allocate it on the heap, so
                // do the same for the whole arguments object.

                // Formal is referenced. So count of formals to function > 0.
                // So no need to check for inParams here.

                symScope->GetFunc()->SetHasHeapArguments(true);
            }
            if (symScope->GetFunc() != top)
            {
                top->SetHasClosureReference(true);
            }
        }
        else if (!nonLocalRef && sym->GetHasNonLocalReference() && !sym->GetIsCommittedToSlot() && !sym->HasVisitedCapturingFunc())
        {
            sym->SetHasNonCommittedReference(true);
        }

        if (sym->GetIsFuncExpr())
        {
            symScope->GetFunc()->SetFuncExprNameReference(true);
        }
    }

    return sym;
}